

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int __thiscall geemuboi::core::CPU::rra(CPU *this)

{
  byte bVar1;
  uint8_t carry;
  CPU *this_local;
  
  bVar1 = this->regs->f;
  this->regs->f = '\0';
  if ((this->regs->a & 1) != 0) {
    this->regs->f = this->regs->f | 0x10;
  }
  this->regs->a = (char)((int)(uint)this->regs->a >> 1) + (bVar1 & 0x10) * '\b';
  return 1;
}

Assistant:

int CPU::rra() {
    uint8_t carry = (regs.f & 0x10) << 3;
    regs.f = 0;
    if (regs.a & 0x1) {
        regs.f |= 0x10;
    }

    regs.a = (regs.a >> 1) + carry;
    return 1;
}